

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_file_exception(sexp ctx,sexp self,char *ms,sexp ir)

{
  sexp psVar1;
  sexp res;
  sexp_gc_var_t local_28;
  
  local_28.var = &res;
  res = (sexp)&DAT_0000043e;
  local_28.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_28;
  res = sexp_user_exception(ctx,self,ms,ir);
  psVar1 = sexp_intern(ctx,"file",-1);
  (res->value).type.name = psVar1;
  (ctx->value).context.saves = local_28.next;
  return res;
}

Assistant:

sexp sexp_file_exception (sexp ctx, sexp self, const char *ms, sexp ir) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_user_exception(ctx, self, ms, ir);
  sexp_exception_kind(res) = sexp_intern(ctx, "file", -1);
  sexp_gc_release1(ctx);
  return res;
}